

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O3

void __thiscall groundupdbext::HighwayHash::HighwayHash(HighwayHash *this)

{
  uint64_t *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  HighwayHashCatT<1U> *pHVar12;
  HHResult64 *pHVar13;
  long lVar14;
  Lanes rotated_keys;
  uint local_38 [10];
  
  this->m_key[2] = 3;
  this->m_key[3] = 4;
  this->m_key[0] = 1;
  this->m_key[1] = 2;
  pHVar12 = (HighwayHashCatT<1U> *)operator_new(0xc0,0x40);
  lVar14 = 0;
  do {
    puVar1 = this->m_key + lVar14;
    uVar10 = *puVar1;
    uVar4 = *(uint *)((long)puVar1 + 4);
    uVar11 = puVar1[1];
    local_38[lVar14 * 2] = uVar4;
    local_38[lVar14 * 2 + 1] = (uint)uVar10;
    local_38[lVar14 * 2 + 2] = uVar4;
    local_38[lVar14 * 2 + 3] = (uint)uVar11;
    lVar14 = lVar14 + 2;
  } while (lVar14 != 4);
  (pHVar12->state_).mul0[2] = 0x13198a2e03707344;
  (pHVar12->state_).mul0[3] = 0x243f6a8885a308d3;
  (pHVar12->state_).mul0[0] = 0xdbe6d5d5fe4cce2f;
  (pHVar12->state_).mul0[1] = 0xa4093822299f31d0;
  (pHVar12->state_).mul1[0] = 0x3bd39e10cb0ef593;
  (pHVar12->state_).mul1[1] = 0xc0acf169b5f18a8c;
  (pHVar12->state_).mul1[2] = 0xbe5466cf34e90c6c;
  (pHVar12->state_).mul1[3] = 0x452821e638d01377;
  lVar14 = 0;
  do {
    puVar2 = (uint *)((long)this->m_key + lVar14);
    uVar4 = puVar2[1];
    uVar5 = puVar2[2];
    uVar6 = puVar2[3];
    uVar7 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                     lVar14 + 4);
    uVar8 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                     lVar14 + 8);
    uVar9 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                     lVar14 + 0xc);
    puVar3 = (uint *)((long)(pHVar12->state_).v0 + lVar14);
    *puVar3 = *puVar2 ^ *(uint *)(highwayhash::Portable::HHStatePortable::
                                  Reset(unsigned_long_const*)::init0 + lVar14);
    puVar3[1] = uVar4 ^ uVar7;
    puVar3[2] = uVar5 ^ uVar8;
    puVar3[3] = uVar6 ^ uVar9;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x20);
  lVar14 = 0;
  do {
    uVar4 = *(uint *)((long)local_38 + lVar14 + 4);
    uVar5 = *(uint *)((long)local_38 + lVar14 + 8);
    uVar6 = *(uint *)((long)local_38 + lVar14 + 0xc);
    uVar7 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                     lVar14 + 4);
    uVar8 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                     lVar14 + 8);
    uVar9 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                     lVar14 + 0xc);
    puVar2 = (uint *)((long)(pHVar12->state_).v1 + lVar14);
    *puVar2 = *(uint *)((long)local_38 + lVar14) ^
              *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                       lVar14);
    puVar2[1] = uVar4 ^ uVar7;
    puVar2[2] = uVar5 ^ uVar8;
    puVar2[3] = uVar6 ^ uVar9;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x20);
  pHVar12->buffer_usage_ = 0;
  pHVar12->buffer_[0] = '\0';
  pHVar12->buffer_[1] = '\0';
  pHVar12->buffer_[2] = '\0';
  pHVar12->buffer_[3] = '\0';
  pHVar12->buffer_[4] = '\0';
  pHVar12->buffer_[5] = '\0';
  pHVar12->buffer_[6] = '\0';
  pHVar12->buffer_[7] = '\0';
  pHVar12->buffer_[8] = '\0';
  pHVar12->buffer_[9] = '\0';
  pHVar12->buffer_[10] = '\0';
  pHVar12->buffer_[0xb] = '\0';
  pHVar12->buffer_[0xc] = '\0';
  pHVar12->buffer_[0xd] = '\0';
  pHVar12->buffer_[0xe] = '\0';
  pHVar12->buffer_[0xf] = '\0';
  pHVar12->buffer_[0x10] = '\0';
  pHVar12->buffer_[0x11] = '\0';
  pHVar12->buffer_[0x12] = '\0';
  pHVar12->buffer_[0x13] = '\0';
  pHVar12->buffer_[0x14] = '\0';
  pHVar12->buffer_[0x15] = '\0';
  pHVar12->buffer_[0x16] = '\0';
  pHVar12->buffer_[0x17] = '\0';
  pHVar12->buffer_[0x18] = '\0';
  pHVar12->buffer_[0x19] = '\0';
  pHVar12->buffer_[0x1a] = '\0';
  pHVar12->buffer_[0x1b] = '\0';
  pHVar12->buffer_[0x1c] = '\0';
  pHVar12->buffer_[0x1d] = '\0';
  pHVar12->buffer_[0x1e] = '\0';
  pHVar12->buffer_[0x1f] = '\0';
  this->m_hh = pHVar12;
  pHVar13 = (HHResult64 *)operator_new(8);
  *pHVar13 = 0;
  this->m_result = pHVar13;
  return;
}

Assistant:

HighwayHash::HighwayHash()
  : m_key{1,2,3,4},
    m_hh(new HighwayHashCatT<HH_TARGET>(m_key)),
    m_result(new HHResult64())
{
  ;
}